

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs.c
# Opt level: O1

int partOfMountPoint(DirHandle *h,char *fname)

{
  char *__s;
  int iVar1;
  size_t __n;
  size_t sVar2;
  uint uVar3;
  
  __s = h->mountPoint;
  uVar3 = 0;
  if (__s != (char *)0x0) {
    if (*fname == '\0') {
      uVar3 = 1;
    }
    else {
      __n = strlen(fname);
      sVar2 = strlen(__s);
      if (__n + 1 != sVar2 && __n <= sVar2) {
        iVar1 = strncmp(fname,__s,__n);
        if (iVar1 == 0) {
          uVar3 = (uint)(__s[__n] == '/');
        }
      }
    }
  }
  return uVar3;
}

Assistant:

static int partOfMountPoint(DirHandle *h, char *fname)
{
    int rc;
    size_t len, mntpntlen;

    if (h->mountPoint == NULL)
        return 0;
    else if (*fname == '\0')
        return 1;

    len = strlen(fname);
    mntpntlen = strlen(h->mountPoint);
    if (len > mntpntlen)  /* can't be a subset of mountpoint. */
        return 0;

    /* if true, must be not a match or a complete match, but not a subset. */
    if ((len + 1) == mntpntlen)
        return 0;

    rc = strncmp(fname, h->mountPoint, len); /* !!! FIXME: case insensitive? */
    if (rc != 0)
        return 0;  /* not a match. */

    /* make sure /a/b matches /a/b/ and not /a/bc ... */
    return h->mountPoint[len] == '/';
}